

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O3

intb __thiscall TokenField::getValue(TokenField *this,ParserWalker *walker)

{
  bool bVar1;
  uintm uVar2;
  uint size;
  uint size_00;
  ulong uVar3;
  int iVar4;
  ulong local_38;
  
  iVar4 = this->bytestart;
  bVar1 = this->bigendian;
  uVar3 = 0;
  size = (this->byteend - iVar4) + 1;
  for (size_00 = size; 3 < size_00; size_00 = size_00 - 4) {
    uVar2 = ParserContext::getInstructionBytes(walker->const_context,iVar4,4,walker->point->offset);
    uVar3 = uVar3 << 0x20 | (ulong)uVar2;
    iVar4 = iVar4 + 4;
  }
  local_38 = uVar3;
  if (size_00 != 0) {
    uVar2 = ParserContext::getInstructionBytes
                      (walker->const_context,iVar4,size_00,walker->point->offset);
    local_38 = uVar3 << ((byte)(size_00 << 3) & 0x3f) | (ulong)uVar2;
  }
  if (bVar1 == false) {
    byte_swap((intb *)&local_38,size);
  }
  local_38 = (long)local_38 >> ((byte)this->shift & 0x3f);
  iVar4 = this->bitend - this->bitstart;
  if (this->signbit == true) {
    sign_extend((intb *)&local_38,iVar4);
  }
  else {
    zero_extend((intb *)&local_38,iVar4);
  }
  return local_38;
}

Assistant:

intb TokenField::getValue(ParserWalker &walker) const

{				// Construct value given specific instruction stream
  intb res = getInstructionBytes(walker,bytestart,byteend,bigendian);
  
  res >>= shift;
  if (signbit)
    sign_extend(res,bitend-bitstart);
  else
    zero_extend(res,bitend-bitstart);
  return res;
}